

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

bv_uint64 bsim::get_shift_int(quad_value_bit_vector *shift_amount)

{
  int iVar1;
  byte bVar2;
  unsigned_short uVar3;
  uint uVar4;
  bv_uint64 bVar5;
  
  iVar1 = shift_amount->N;
  if (0x40 < iVar1) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x3b0,"bv_uint64 bsim::get_shift_int(const quad_value_bit_vector &)");
  }
  if (iVar1 < 0x21) {
    if (iVar1 < 0x11) {
      if (iVar1 < 9) {
        bVar2 = quad_value_bit_vector::to_type<unsigned_char>(shift_amount);
        bVar5 = (bv_uint64)bVar2;
      }
      else {
        uVar3 = quad_value_bit_vector::to_type<unsigned_short>(shift_amount);
        bVar5 = (bv_uint64)uVar3;
      }
    }
    else {
      uVar4 = quad_value_bit_vector::to_type<unsigned_int>(shift_amount);
      bVar5 = (bv_uint64)uVar4;
    }
  }
  else {
    bVar5 = quad_value_bit_vector::to_type<unsigned_long>(shift_amount);
  }
  if (bVar5 < 0x41) {
    return bVar5;
  }
  __assert_fail("shift_int < 65",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                ,0x3c2,"bv_uint64 bsim::get_shift_int(const quad_value_bit_vector &)");
}

Assistant:

static inline
  bv_uint64 get_shift_int(const quad_value_bit_vector& shift_amount) {
    bv_uint64 shift_int = 0;
    if (shift_amount.bitLength() > 64) {
      assert(false);
    }

    else if (shift_amount.bitLength() > 32) {
      shift_int = shift_amount.to_type<bv_uint64>();
    }

    else if (shift_amount.bitLength() > 16) {
      shift_int = (bv_uint64) (shift_amount.to_type<bv_uint32>());
    }

    else if (shift_amount.bitLength() > 8) {
      shift_int = (bv_uint64) (shift_amount.to_type<bv_uint16>());
    } else {
      shift_int = (bv_uint64) (shift_amount.to_type<bv_uint8>());
    }

    //std::cout << "shift_int = " << shift_int << std::endl;
    assert(shift_int < 65);

    return shift_int;
  }